

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_space_lagrange_o1.h
# Opt level: O3

void __thiscall
lf::uscalfe::FeSpaceLagrangeO1<double>::FeSpaceLagrangeO1
          (FeSpaceLagrangeO1<double> *this,shared_ptr<const_lf::mesh::Mesh> *mesh_p)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_60;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_50;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_40;
  shared_ptr<const_lf::mesh::Mesh> local_30;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_20;
  
  local_30.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_30.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_30.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_30.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_40.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_40.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_use_count = 1;
  (local_40.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_weak_count = 1;
  (local_40.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0036eb10;
  local_40.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            (local_40.
             super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi + 1);
  local_40.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._vptr__Sp_counted_base =
       (_func_int **)&PTR__ScalarReferenceFiniteElement_0036eb60;
  local_50.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_50.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_use_count = 1;
  (local_50.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_weak_count = 1;
  (local_50.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0036ebe8;
  local_50.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            (local_50.
             super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi + 1);
  local_50.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._vptr__Sp_counted_base =
       (_func_int **)&PTR__ScalarReferenceFiniteElement_0036ec38;
  local_60.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_60.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_use_count = 1;
  (local_60.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_weak_count = 1;
  (local_60.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0036ecc0;
  local_60.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            (local_60.
             super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi + 1);
  local_60.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._vptr__Sp_counted_base =
       (_func_int **)&PTR__ScalarReferenceFiniteElement_0036ed10;
  local_20.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_20.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_use_count = 1;
  (local_20.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_weak_count = 1;
  (local_20.
   super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0036ed98;
  local_20.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            (local_20.
             super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi + 1);
  local_20.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._vptr__Sp_counted_base =
       (_func_int **)&PTR__ScalarReferenceFiniteElement_0036ede8;
  local_20.
  super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._M_use_count = 1;
  UniformScalarFESpace<double>::UniformScalarFESpace
            (&this->super_UniformScalarFESpace<double>,&local_30,&local_40,&local_50,&local_60,
             &local_20);
  if (local_20.
      super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.
               super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_60.
      super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_50.
      super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.
               super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_40.
      super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_30.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_UniformScalarFESpace<double>).super_ScalarFESpace<double>._vptr_ScalarFESpace =
       (_func_int **)&PTR_Mesh_0036ea90;
  return;
}

Assistant:

explicit FeSpaceLagrangeO1(
      const std::shared_ptr<const lf::mesh::Mesh> &mesh_p)
      : UniformScalarFESpace<SCALAR>(
            mesh_p, std::make_shared<FeLagrangeO1Tria<SCALAR>>(),
            std::make_shared<FeLagrangeO1Quad<SCALAR>>(),
            std::make_shared<FeLagrangeO1Segment<SCALAR>>(),
            std::make_shared<fe::FePoint<SCALAR>>(1)) {}